

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_create_key_exchange(ptls_key_exchange_context_t **ctx,EVP_PKEY *pkey)

{
  int iVar1;
  ec_key_st *key;
  EC_GROUP *group;
  ptls_key_exchange_algorithm_t *local_38;
  ptls_key_exchange_algorithm_t *algo;
  EC_KEY *eckey;
  int id;
  int ret;
  EVP_PKEY *pkey_local;
  ptls_key_exchange_context_t **ctx_local;
  
  iVar1 = EVP_PKEY_get_id(pkey);
  if (iVar1 == 0x198) {
    key = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)pkey);
    group = EC_KEY_get0_group(key);
    iVar1 = EC_GROUP_get_curve_name(group);
    if (iVar1 == 0x19f) {
      local_38 = &ptls_openssl_secp256r1;
    }
    else if (iVar1 == 0x2cb) {
      local_38 = &ptls_openssl_secp384r1;
    }
    else {
      if (iVar1 != 0x2cc) {
        EC_KEY_free(key);
        return 0x204;
      }
      local_38 = &ptls_openssl_secp521r1;
    }
    ctx_local._4_4_ = x9_62_init_key(local_38,ctx,(EC_KEY *)key);
    if (ctx_local._4_4_ == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      EC_KEY_free(key);
    }
  }
  else if (iVar1 == 0x40a) {
    ctx_local._4_4_ = evp_keyex_init(&ptls_openssl_x25519,ctx,pkey);
    if (ctx_local._4_4_ == 0) {
      EVP_PKEY_up_ref(pkey);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = 0x204;
  }
  return ctx_local._4_4_;
}

Assistant:

int ptls_openssl_create_key_exchange(ptls_key_exchange_context_t **ctx, EVP_PKEY *pkey)
{
    int ret, id;

    switch (id = EVP_PKEY_id(pkey)) {

    case EVP_PKEY_EC: {
        /* obtain eckey */
        EC_KEY *eckey = EVP_PKEY_get1_EC_KEY(pkey);

        /* determine algo */
        ptls_key_exchange_algorithm_t *algo;
        switch (EC_GROUP_get_curve_name(EC_KEY_get0_group(eckey))) {
        case NID_X9_62_prime256v1:
            algo = &ptls_openssl_secp256r1;
            break;
#if PTLS_OPENSSL_HAVE_SECP384R1
        case NID_secp384r1:
            algo = &ptls_openssl_secp384r1;
            break;
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
        case NID_secp521r1:
            algo = &ptls_openssl_secp521r1;
            break;
#endif
        default:
            EC_KEY_free(eckey);
            return PTLS_ERROR_INCOMPATIBLE_KEY;
        }

        /* load key */
        if ((ret = x9_62_init_key(algo, ctx, eckey)) != 0) {
            EC_KEY_free(eckey);
            return ret;
        }

        return 0;
    } break;

#if PTLS_OPENSSL_HAVE_X25519
    case NID_X25519:
        if ((ret = evp_keyex_init(&ptls_openssl_x25519, ctx, pkey)) != 0)
            return ret;
        EVP_PKEY_up_ref(pkey);
        return 0;
#endif

    default:
        return PTLS_ERROR_INCOMPATIBLE_KEY;
    }
}